

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LameWrapper.cpp
# Opt level: O2

int __thiscall cinemo::LameWrapper::init(LameWrapper *this,EVP_PKEY_CTX *ctx)

{
  pointer in_RAX;
  WaveHeader *__p;
  
  if (this->initDone == false) {
    __p = wh::parseWaveHeader(&this->path);
    std::__uniq_ptr_impl<cinemo::wh::WaveHeader,_std::default_delete<cinemo::wh::WaveHeader>_>::
    reset((__uniq_ptr_impl<cinemo::wh::WaveHeader,_std::default_delete<cinemo::wh::WaveHeader>_> *)
          &this->wh,__p);
    (this->message_buffer)._M_string_length = 0;
    in_RAX = (this->message_buffer)._M_dataplus._M_p;
    *in_RAX = '\0';
    this->initDone = true;
  }
  return (int)in_RAX;
}

Assistant:

void LameWrapper::init() {
		if (!initDone) {
			wh.reset(std::move(wh::parseWaveHeader(path)));
			message_buffer.clear();
			initDone = true;
		}
    }